

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

BeliefUpperBound * __thiscall despot::BaseTag::CreateBeliefUpperBound(BaseTag *this,string *name)

{
  bool bVar1;
  TrivialBeliefUpperBound *this_00;
  TagManhattanUpperBound *this_01;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_00 = (TrivialBeliefUpperBound *)operator_new(0x10);
    despot::TrivialBeliefUpperBound::TrivialBeliefUpperBound
              (this_00,(DSPOMDP *)&this->super_BeliefMDP);
    return (BeliefUpperBound *)this_00;
  }
  bVar1 = std::operator==(name,"DEFAULT");
  if ((bVar1) || (bVar1 = std::operator==(name,"MDP"), bVar1)) {
    this_01 = (TagManhattanUpperBound *)operator_new(0x38);
    despot::MDPUpperBound::MDPUpperBound
              ((MDPUpperBound *)this_01,&this->super_MDP,&this->super_StateIndexer);
  }
  else {
    bVar1 = std::operator==(name,"MANHATTAN");
    if (!bVar1) {
      bVar1 = std::operator!=(name,"print");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief upper bound: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Supported types: TRIVIAL, MDP, MANHATTAN (default to MDP)");
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
    this_01 = (TagManhattanUpperBound *)operator_new(0x30);
    TagManhattanUpperBound::TagManhattanUpperBound(this_01,this);
  }
  return &this_01->super_BeliefUpperBound;
}

Assistant:

BeliefUpperBound* BaseTag::CreateBeliefUpperBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefUpperBound(this);
	} else if (name == "DEFAULT" || name == "MDP") {
		return new MDPUpperBound(this, *this);
	} else if (name == "MANHATTAN") {
		return new TagManhattanUpperBound(this);
	} else {
		if (name != "print")
			cerr << "Unsupported belief upper bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, MANHATTAN (default to MDP)" << endl;
		exit(1);
		return NULL;
	}
}